

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_t_bad.c
# Opt level: O1

void test_t_bad(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_t_bad.zip");
  wVar1 = systemf("%s -t %s >test.out 2>test.err",testprog,"test_t_bad.zip");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_t_bad.c"
                   ,L'\x11',(uint)(wVar1 != L'\0'),"r != 0",(void *)0x0);
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_t_bad.c"
             ,L'\x12',"test.out");
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_t_bad.c"
             ,L'\x13',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_t_bad)
{
	const char *reffile = "test_t_bad.zip";
	int r;

	extract_reference_file(reffile);
	r = systemf("%s -t %s >test.out 2>test.err", testprog, reffile);
	assert(r != 0);
	assertNonEmptyFile("test.out");
	assertNonEmptyFile("test.err");
}